

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * __thiscall rw::Matrix::translate(Matrix *this,V3d *translation,CombineOp op)

{
  undefined1 auStack_a8 [8];
  Matrix trans;
  undefined1 local_5c [8];
  Matrix tmp;
  CombineOp op_local;
  V3d *translation_local;
  Matrix *this_local;
  
  trans._24_8_ = identMat._32_8_;
  trans.at._0_8_ = identMat._40_8_;
  trans._8_8_ = identMat._16_8_;
  trans.up._0_8_ = identMat._24_8_;
  auStack_a8 = (undefined1  [8])identMat._0_8_;
  trans.pos.y = SUB84(identMat._56_8_,4);
  trans.pos.x = translation->z;
  trans.at.z = translation->x;
  trans.pad2 = (uint32)translation->y;
  trans.right._0_8_ = identMat._8_8_ & 0xfffdffffffffffff;
  tmp.pos.z = (float32)op;
  unique0x100001e4 = translation;
  if (op == COMBINEREPLACE) {
    memcpy(this,auStack_a8,0x40);
  }
  else if (op == COMBINEPRECONCAT) {
    mult((Matrix *)local_5c,(Matrix *)auStack_a8,this);
    memcpy(this,local_5c,0x40);
  }
  else if (op == COMBINEPOSTCONCAT) {
    mult((Matrix *)local_5c,this,(Matrix *)auStack_a8);
    memcpy(this,local_5c,0x40);
  }
  return this;
}

Assistant:

Matrix*
Matrix::translate(const V3d *translation, CombineOp op)
{
	Matrix tmp;
	Matrix trans = identMat;
	trans.pos = *translation;
	trans.flags &= ~IDENTITY;
	switch(op){
	case COMBINEREPLACE:
		*this = trans;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &trans, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &trans);
		*this = tmp;
		break;
	}
	return this;
}